

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pages.c
# Opt level: O0

void * os_pages_map(void *addr,size_t size,size_t alignment,_Bool *commit)

{
  int __prot;
  byte *in_RCX;
  size_t in_RSI;
  void *in_RDI;
  size_t in_stack_00000008;
  int prot;
  void *ret;
  void *local_28;
  
  if (os_overcommits) {
    *in_RCX = 1;
  }
  __prot = 0;
  if ((*in_RCX & 1) != 0) {
    __prot = 3;
  }
  local_28 = mmap(in_RDI,in_RSI,__prot,mmap_flags,-1,0);
  if (local_28 == (void *)0xffffffffffffffff) {
    local_28 = (void *)0x0;
  }
  else if ((in_RDI != (void *)0x0) && (local_28 != in_RDI)) {
    os_pages_unmap(ret,in_stack_00000008);
    local_28 = (void *)0x0;
  }
  return local_28;
}

Assistant:

static void *
os_pages_map(void *addr, size_t size, size_t alignment, bool *commit) {
	assert(ALIGNMENT_ADDR2BASE(addr, os_page) == addr);
	assert(ALIGNMENT_CEILING(size, os_page) == size);
	assert(size != 0);

	if (os_overcommits) {
		*commit = true;
	}

	void *ret;
#ifdef _WIN32
	/*
	 * If VirtualAlloc can't allocate at the given address when one is
	 * given, it fails and returns NULL.
	 */
	ret = VirtualAlloc(addr, size, MEM_RESERVE | (*commit ? MEM_COMMIT : 0),
	    PAGE_READWRITE);
#else
	/*
	 * We don't use MAP_FIXED here, because it can cause the *replacement*
	 * of existing mappings, and we only want to create new mappings.
	 */
	{
		int prot = *commit ? PAGES_PROT_COMMIT : PAGES_PROT_DECOMMIT;

		ret = mmap(addr, size, prot, mmap_flags, -1, 0);
	}
	assert(ret != NULL);

	if (ret == MAP_FAILED) {
		ret = NULL;
	} else if (addr != NULL && ret != addr) {
		/*
		 * We succeeded in mapping memory, but not in the right place.
		 */
		os_pages_unmap(ret, size);
		ret = NULL;
	}
#endif
	assert(ret == NULL || (addr == NULL && ret != addr) || (addr != NULL &&
	    ret == addr));
	return ret;
}